

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

int Wlc_NtkMemUsage(Wlc_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  iVar1 = (p->vPos).nCap;
  iVar2 = (p->vPis).nCap;
  iVar3 = (p->vCis).nCap;
  iVar4 = (p->vCos).nCap;
  iVar5 = (p->vFfs).nCap;
  iVar6 = (p->vFfs2).nCap;
  iVar7 = p->nObjsAlloc;
  iVar8 = Abc_NamMemUsed(p->pManName);
  iVar9 = Mem_FlexReadMemUsage(p->pMemFanin);
  return iVar9 + iVar8 + iVar7 * 0x18 + (iVar1 + iVar2 + iVar3 + iVar4 + iVar5 + iVar6) * 4 + 0x340;
}

Assistant:

int Wlc_NtkMemUsage( Wlc_Ntk_t * p )
{
    int Mem = sizeof(Wlc_Ntk_t);
    Mem += 4 * p->vPis.nCap;
    Mem += 4 * p->vPos.nCap;
    Mem += 4 * p->vCis.nCap;
    Mem += 4 * p->vCos.nCap;
    Mem += 4 * p->vFfs.nCap;
    Mem += 4 * p->vFfs2.nCap;
    Mem += sizeof(Wlc_Obj_t) * p->nObjsAlloc;
    Mem += Abc_NamMemUsed(p->pManName);
    Mem += Mem_FlexReadMemUsage(p->pMemFanin);
    return Mem;
}